

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O1

void __thiscall TiXmlNode::~TiXmlNode(TiXmlNode *this)

{
  TiXmlNode *pTVar1;
  Rep *pRVar2;
  TiXmlBase *pTVar3;
  
  (this->super_TiXmlBase)._vptr_TiXmlBase = (_func_int **)&PTR__TiXmlNode_002186e0;
  pTVar1 = this->firstChild;
  while (pTVar1 != (TiXmlNode *)0x0) {
    pTVar3 = &pTVar1->super_TiXmlBase;
    pTVar1 = pTVar1->next;
    (*pTVar3->_vptr_TiXmlBase[1])();
  }
  pRVar2 = (this->value).rep_;
  if (pRVar2 != (Rep *)0x0 && pRVar2 != &TiXmlString::nullrep_) {
    operator_delete__(pRVar2);
    return;
  }
  return;
}

Assistant:

TiXmlNode::~TiXmlNode()
{
	TiXmlNode* node = firstChild;
	TiXmlNode* temp = 0;

	while ( node )
	{
		temp = node;
		node = node->next;
		delete temp;
	}	
}